

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_examples.cpp
# Opt level: O1

void saveToFile(int **mrx,int height,int width,char *filename)

{
  FILE *__stream;
  ulong uVar1;
  ulong uVar2;
  
  __stream = fopen(filename,"w");
  if (0 < height) {
    uVar1 = 0;
    do {
      if (0 < width) {
        uVar2 = 0;
        do {
          fprintf(__stream,"%3d,",(ulong)(uint)mrx[uVar1][uVar2]);
          uVar2 = uVar2 + 1;
        } while ((uint)width != uVar2);
      }
      fputc(10,__stream);
      uVar1 = uVar1 + 1;
    } while (uVar1 != (uint)height);
  }
  fclose(__stream);
  return;
}

Assistant:

void saveToFile(int **mrx, const int height, const int width, const char *filename) {
    FILE *file = fopen(filename, "w");
    for (int i = 0; i < height; i++) {
        for (int j = 0; j < width; j++) {
            fprintf(file, "%3d,", mrx[i][j]);
        }
        fprintf(file, "\n");
    }
    fclose(file);
}